

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luma_quantizer.cpp
# Opt level: O0

void __thiscall
LumaQuantizer::setQuantizer
          (LumaQuantizer *this,ptf_t ptf,uint bitdepth,colorSpace_t cs,uint bitdepthC,float maxLum,
          float minLum)

{
  float *pfVar1;
  double dVar2;
  undefined4 in_XMM1_Db;
  float local_50;
  ulong local_30;
  size_t i;
  float minLum_local;
  float maxLum_local;
  uint bitdepthC_local;
  colorSpace_t cs_local;
  uint bitdepth_local;
  ptf_t ptf_local;
  LumaQuantizer *this_local;
  
  if ((this->m_mapping != (float *)0x0) && (this->m_mapping != (float *)0x0)) {
    operator_delete__(this->m_mapping);
  }
  this->m_bitdepth = bitdepth;
  dVar2 = std::pow(5.30498947741318e-315,(double)CONCAT44(in_XMM1_Db,(float)bitdepth));
  this->m_maxVal = (int)SUB84(dVar2,0) - 1;
  this->m_colorSpace = cs;
  this->m_bitdepthColor = bitdepthC;
  dVar2 = std::pow(5.30498947741318e-315,
                   (double)CONCAT44((int)((ulong)dVar2 >> 0x20),(float)bitdepthC));
  this->m_maxValColor = (int)SUB84(dVar2,0) - 1;
  this->m_Lmax = maxLum;
  this->m_Lmin = minLum;
  pfVar1 = (float *)operator_new__((ulong)(this->m_maxVal + 1) << 2);
  this->m_mapping = pfVar1;
  switch(ptf) {
  case PTF_PSI:
  default:
    setMappingPsi(this);
    break;
  case PTF_PQ:
    setMappingPQ(this);
    break;
  case PTF_LOG:
    setMappingLog(this);
    break;
  case PTF_JND_HDRVDP:
    setMappingJNDHDRVDP(this);
    break;
  case PTF_LINEAR:
    for (local_30 = 0; local_30 <= this->m_maxVal; local_30 = local_30 + 1) {
      local_50 = (float)local_30;
      this->m_mapping[local_30] = this->m_Lmax * (local_50 / (float)this->m_maxVal);
    }
  }
  return;
}

Assistant:

void LumaQuantizer::setQuantizer(ptf_t ptf, unsigned int bitdepth,
                                 colorSpace_t cs, unsigned int bitdepthC,
                                 float maxLum, float minLum)
{
    if (m_mapping != NULL)
        delete[] m_mapping;
    
    m_bitdepth = bitdepth;
    m_maxVal = (int)pow(2.0f,(float)bitdepth)-1;
    m_colorSpace = cs;
    m_bitdepthColor = bitdepthC;
    m_maxValColor = (int)pow(2.0f,(float)bitdepthC)-1;
    m_Lmax = maxLum;
    m_Lmin = minLum;
    
    m_mapping = new float[m_maxVal+1];
    
    switch (ptf)
    {
    case PTF_PQ:
        setMappingPQ();
        break;
    case PTF_LOG:
        setMappingLog();
        break;
    case PTF_JND_HDRVDP:
        setMappingJNDHDRVDP();
        break;
    case PTF_LINEAR:
        for (size_t i=0; i<=m_maxVal; i++)
	        m_mapping[i] = m_Lmax*((float)i/m_maxVal);
	    break;
    case PTF_PSI:
    default:
        setMappingPsi();
        break;
    }
    
    //for (int i = 0; i<=m_maxVal; i++)
    //    fprintf(stderr, "%0.8f, ", m_mapping[i]);
}